

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O0

void __thiscall
CVmObjIterIdx::load_from_image(CVmObjIterIdx *this,vm_obj_id_t self,char *ptr,size_t siz)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  CVmObjIterIdx *this_00;
  undefined4 extraout_var;
  char *in_RCX;
  void *in_RDX;
  undefined4 in_ESI;
  size_t in_RDI;
  char *flags;
  vm_obj_id_t obj_id;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(long *)(in_RDI + 8) != 0) {
    pCVar2 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar2->_vptr_CVmVarHeap[6])(pCVar2,*(undefined8 *)(in_RDI + 8));
    *(undefined8 *)(in_RDI + 8) = 0;
  }
  this_00 = (CVmObjIterIdx *)CVmMemory::get_var_heap(G_mem_X);
  flags = in_RCX;
  if (in_RCX < (char *)0x15) {
    flags = (char *)0x15;
  }
  iVar1 = (*(this_00->super_CVmObjIter).super_CVmObject._vptr_CVmObject[4])(this_00,flags,in_RDI);
  *(ulong *)(in_RDI + 8) = CONCAT44(extraout_var,iVar1);
  memcpy(*(void **)(in_RDI + 8),in_RDX,(size_t)in_RCX);
  obj_id = (vm_obj_id_t)((ulong)in_RDX >> 0x20);
  get_flags((CVmObjIterIdx *)0x367343);
  set_flags(this_00,(unsigned_long)flags);
  CVmObjTable::save_image_pointer
            ((CVmObjTable *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),obj_id,in_RCX,in_RDI);
  return;
}

Assistant:

void CVmObjIterIdx::load_from_image(VMG_ vm_obj_id_t self,
                                    const char *ptr, size_t siz)
{
    /* if we already have memory allocated, free it */
    if (ext_ != 0)
    {
        G_mem->get_var_heap()->free_mem(ext_);
        ext_ = 0;
    }

    /* 
     *   Allocate a new extension.  Make sure it's at least as large as
     *   the current standard extension size.  
     */
    ext_ = (char *)G_mem->get_var_heap()
           ->alloc_mem(siz < VMOBJITERIDX_EXT_SIZE
                       ? VMOBJITERIDX_EXT_SIZE : siz, this);

    /* copy the image data to our extension */
    memcpy(ext_, ptr, siz);

    /* clear the undo flag */
    set_flags(get_flags() & ~VMOBJITERIDX_UNDO);

    /* save our image data pointer, so we can use it for reloading */
    G_obj_table->save_image_pointer(self, ptr, siz);
}